

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cfd::core::WallyUtil::GetMnemonicWordlist
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *language)

{
  words *this;
  size_t in_RCX;
  undefined1 local_60 [8];
  string word;
  size_t i;
  words *wally_wordlist;
  string *language_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *wordlist;
  
  this = Bip39GetWordlist(language);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,0x800);
  for (word.field_2._8_8_ = 0; (ulong)word.field_2._8_8_ < 0x800;
      word.field_2._8_8_ = word.field_2._8_8_ + 1) {
    GetMnemonicWord_abi_cxx11_
              ((string *)local_60,(WallyUtil *)this,(words *)word.field_2._8_8_,in_RCX);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__return_storage_ptr__,(value_type *)local_60);
    ::std::__cxx11::string::~string((string *)local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> WallyUtil::GetMnemonicWordlist(
    const std::string& language) {
  words* wally_wordlist = Bip39GetWordlist(language);

  std::vector<std::string> wordlist;
  wordlist.reserve(kWordlistLength);
  for (size_t i = 0; i < kWordlistLength; ++i) {
    std::string word = GetMnemonicWord(wally_wordlist, i);
    wordlist.push_back(word);
  }

  return wordlist;
}